

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::leftJustified
          (QString *__return_storage_ptr__,QString *this,qsizetype width,QChar fill,bool truncate)

{
  long lVar1;
  char16_t *pcVar2;
  QArrayData *data;
  qsizetype qVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  long lVar13;
  long lVar14;
  long in_FS_OFFSET;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar39 [16];
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (this->d).size;
  lVar13 = width - lVar1;
  if (lVar13 == 0 || width < lVar1) {
    if (!truncate) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QArrayDataPointer<char16_t>::operator=(&__return_storage_ptr__->d,&this->d);
        return __return_storage_ptr__;
      }
      goto LAB_00121952;
    }
    left(&local_48,this,width);
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)data;
    local_48.d.ptr = pcVar2;
    local_48.d.size = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  else {
    resize(__return_storage_ptr__,width);
    if (lVar1 != 0) {
      memcpy((__return_storage_ptr__->d).ptr,(this->d).ptr,lVar1 * 2);
    }
    auVar11 = _DAT_00137790;
    auVar10 = _DAT_00137780;
    auVar9 = _DAT_00137770;
    auVar8 = _DAT_00137760;
    auVar7 = _DAT_00137750;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    lVar14 = lVar13 + -1;
    auVar15._8_4_ = (int)lVar14;
    auVar15._0_8_ = lVar14;
    auVar15._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar12 = 0;
    auVar15 = auVar15 ^ _DAT_00137790;
    do {
      auVar27._8_4_ = (int)uVar12;
      auVar27._0_8_ = uVar12;
      auVar27._12_4_ = (int)(uVar12 >> 0x20);
      auVar19 = (auVar27 | auVar10) ^ auVar11;
      iVar28 = auVar15._0_4_;
      iVar34 = -(uint)(iVar28 < auVar19._0_4_);
      iVar16 = auVar15._4_4_;
      auVar20._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
      iVar33 = auVar15._8_4_;
      iVar36 = -(uint)(iVar33 < auVar19._8_4_);
      iVar17 = auVar15._12_4_;
      auVar20._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
      auVar30._4_4_ = iVar34;
      auVar30._0_4_ = iVar34;
      auVar30._8_4_ = iVar36;
      auVar30._12_4_ = iVar36;
      auVar37 = pshuflw(in_XMM11,auVar30,0xe8);
      auVar22._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
      auVar22._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar39 = pshuflw(in_XMM12,auVar22,0xe8);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar38 = pshuflw(auVar37,auVar20,0xe8);
      auVar19._8_4_ = 0xffffffff;
      auVar19._0_8_ = 0xffffffffffffffff;
      auVar19._12_4_ = 0xffffffff;
      auVar19 = (auVar38 | auVar39 & auVar37) ^ auVar19;
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar2[lVar1 + uVar12] = fill.ucs;
      }
      auVar20 = auVar22 & auVar30 | auVar20;
      auVar19 = packssdw(auVar20,auVar20);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar19 = packssdw(auVar19 ^ auVar38,auVar19 ^ auVar38);
      if ((auVar19._0_4_ >> 0x10 & 1) != 0) {
        pcVar2[lVar1 + uVar12 + 1] = fill.ucs;
      }
      auVar19 = (auVar27 | auVar9) ^ auVar11;
      iVar34 = -(uint)(iVar28 < auVar19._0_4_);
      auVar35._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
      iVar36 = -(uint)(iVar33 < auVar19._8_4_);
      auVar35._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
      auVar21._4_4_ = iVar34;
      auVar21._0_4_ = iVar34;
      auVar21._8_4_ = iVar36;
      auVar21._12_4_ = iVar36;
      auVar29._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
      auVar29._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar35._0_4_ = auVar35._4_4_;
      auVar35._8_4_ = auVar35._12_4_;
      auVar19 = auVar29 & auVar21 | auVar35;
      auVar19 = packssdw(auVar19,auVar19);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar19 = packssdw(auVar19 ^ auVar4,auVar19 ^ auVar4);
      if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar2[lVar1 + uVar12 + 2] = fill.ucs;
      }
      auVar22 = pshufhw(auVar21,auVar21,0x84);
      auVar30 = pshufhw(auVar29,auVar29,0x84);
      auVar20 = pshufhw(auVar22,auVar35,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar20 | auVar30 & auVar22) ^ auVar23;
      auVar22 = packssdw(auVar23,auVar23);
      if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar2[lVar1 + uVar12 + 3] = fill.ucs;
      }
      auVar22 = (auVar27 | auVar8) ^ auVar11;
      iVar34 = -(uint)(iVar28 < auVar22._0_4_);
      auVar25._4_4_ = -(uint)(iVar16 < auVar22._4_4_);
      iVar36 = -(uint)(iVar33 < auVar22._8_4_);
      auVar25._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
      auVar31._4_4_ = iVar34;
      auVar31._0_4_ = iVar34;
      auVar31._8_4_ = iVar36;
      auVar31._12_4_ = iVar36;
      auVar19 = pshuflw(auVar19,auVar31,0xe8);
      auVar24._4_4_ = -(uint)(auVar22._4_4_ == iVar16);
      auVar24._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      in_XMM12 = pshuflw(auVar39 & auVar37,auVar24,0xe8);
      in_XMM12 = in_XMM12 & auVar19;
      auVar25._0_4_ = auVar25._4_4_;
      auVar25._8_4_ = auVar25._12_4_;
      auVar19 = pshuflw(auVar19,auVar25,0xe8);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar19 | in_XMM12) ^ auVar37;
      in_XMM11 = packssdw(auVar37,auVar37);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar2[lVar1 + uVar12 + 4] = fill.ucs;
      }
      auVar25 = auVar24 & auVar31 | auVar25;
      auVar19 = packssdw(auVar25,auVar25);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar19 = packssdw(auVar19 ^ auVar39,auVar19 ^ auVar39);
      if ((auVar19 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pcVar2[lVar1 + uVar12 + 5] = fill.ucs;
      }
      auVar19 = (auVar27 | auVar7) ^ auVar11;
      iVar28 = -(uint)(iVar28 < auVar19._0_4_);
      auVar32._4_4_ = -(uint)(iVar16 < auVar19._4_4_);
      iVar33 = -(uint)(iVar33 < auVar19._8_4_);
      auVar32._12_4_ = -(uint)(iVar17 < auVar19._12_4_);
      auVar26._4_4_ = iVar28;
      auVar26._0_4_ = iVar28;
      auVar26._8_4_ = iVar33;
      auVar26._12_4_ = iVar33;
      auVar18._4_4_ = -(uint)(auVar19._4_4_ == iVar16);
      auVar18._12_4_ = -(uint)(auVar19._12_4_ == iVar17);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar19 = auVar18 & auVar26 | auVar32;
      auVar19 = packssdw(auVar19,auVar19);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar19 = packssdw(auVar19 ^ auVar5,auVar19 ^ auVar5);
      if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar2[lVar1 + uVar12 + 6] = fill.ucs;
      }
      auVar27 = pshufhw(auVar26,auVar26,0x84);
      auVar19 = pshufhw(auVar18,auVar18,0x84);
      auVar22 = pshufhw(auVar27,auVar32,0x84);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar19 = packssdw(auVar19 & auVar27,(auVar22 | auVar19 & auVar27) ^ auVar6);
      if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar2[lVar1 + uVar12 + 7] = fill.ucs;
      }
      uVar12 = uVar12 + 8;
    } while ((lVar13 + 7U & 0xfffffffffffffff8) != uVar12);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_00121952:
  __stack_chk_fail();
}

Assistant:

QString QString::leftJustified(qsizetype width, QChar fill, bool truncate) const
{
    QString result;
    qsizetype len = size();
    qsizetype padlen = width - len;
    if (padlen > 0) {
        result.resize(len+padlen);
        if (len)
            memcpy(result.d.data(), d.data(), sizeof(QChar)*len);
        QChar *uc = (QChar*)result.d.data() + len;
        while (padlen--)
           * uc++ = fill;
    } else {
        if (truncate)
            result = left(width);
        else
            result = *this;
    }
    return result;
}